

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void spirv_cross::inner::join_helper<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
               (StringStream<4096UL,_4096UL> *stream,char (*t) [9],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1)

{
  size_t len;
  
  len = strlen(*t);
  StringStream<4096UL,_4096UL>::append(stream,*t,len);
  StringStream<4096UL,_4096UL>::append(stream,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  StringStream<4096UL,_4096UL>::append(stream,(ts_1->_M_dataplus)._M_p,ts_1->_M_string_length);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}